

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O0

void __thiscall IRCCommand::~IRCCommand(IRCCommand *this)

{
  code *pcVar1;
  IRCCommand *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

IRCCommand::~IRCCommand() {
	// Remove any weak references to this
	for (auto itr = IRCMasterCommandList.begin(); itr != IRCMasterCommandList.end(); ++itr) {
		if (*itr == this) {
			serverManager->removeCommand(this);
			IRCMasterCommandList.erase(itr);
			break;
		}
	}
}